

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eve.cpp
# Opt level: O0

void eve::emitevents(OASIS_INT pno_,OASIS_INT total_,vector<int,_std::allocator<int>_> *events,
                    bool textmode)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  int *piVar4;
  uint *puVar5;
  uint local_48 [2];
  int eventid;
  int local_3c;
  int local_38;
  int local_34;
  int end_pos;
  int local_2c;
  int local_28;
  int start_pos;
  int first_min_pno;
  int min_chunksize;
  int total_events;
  bool textmode_local;
  vector<int,_std::allocator<int>_> *events_local;
  OASIS_INT total__local;
  OASIS_INT pno__local;
  
  min_chunksize._3_1_ = textmode;
  _total_events = events;
  events_local._0_4_ = total_;
  events_local._4_4_ = pno_;
  sVar3 = std::vector<int,_std::allocator<int>_>::size(events);
  first_min_pno = (int)sVar3;
  start_pos = first_min_pno / (OASIS_INT)events_local;
  local_28 = first_min_pno % (OASIS_INT)events_local + 1;
  iVar2 = start_pos + 1;
  piVar4 = std::min<int>(&local_28,(int *)((long)&events_local + 4));
  iVar1 = start_pos;
  local_2c = iVar2 * (*piVar4 + -1);
  end_pos = events_local._4_4_ - local_28;
  local_34 = 0;
  piVar4 = std::max<int>(&end_pos,&local_34);
  local_2c = iVar1 * *piVar4 + local_2c;
  iVar2 = start_pos + 1;
  local_3c = events_local._4_4_ + 1;
  piVar4 = std::min<int>(&local_28,&local_3c);
  iVar1 = start_pos;
  local_38 = iVar2 * (*piVar4 + -1);
  eventid = (events_local._4_4_ + 1) - local_28;
  local_48[1] = 0;
  piVar4 = std::max<int>(&eventid,(int *)(local_48 + 1));
  local_38 = iVar1 * *piVar4 + local_38;
  for (; local_2c < local_38; local_2c = local_2c + 1) {
    puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                               (_total_events,(long)local_2c);
    local_48[0] = *puVar5;
    if ((min_chunksize._3_1_ & 1) == 1) {
      fprintf(_stdout,"%d\n",(ulong)local_48[0]);
    }
    else {
      fwrite(local_48,4,1,_stdout);
    }
  }
  return;
}

Assistant:

void emitevents(OASIS_INT pno_, OASIS_INT total_, std::vector<int> &events,
                    bool textmode) {

	int total_events = (int)events.size();
	int min_chunksize = total_events / total_;
	int first_min_pno = (total_events % total_) + 1;
	int start_pos = (min_chunksize + 1) * (std::min(first_min_pno, pno_) - 1);
	start_pos += min_chunksize * std::max(pno_ - first_min_pno, 0);
	int end_pos = (min_chunksize + 1) * (std::min(first_min_pno, pno_+1) - 1);
	end_pos += min_chunksize * std::max(pno_+1 - first_min_pno, 0);

        while (start_pos < end_pos) {
            int eventid = events[start_pos];
            if (textmode == true)
                fprintf(stdout, "%d\n", eventid);
            else
                fwrite(&eventid, sizeof(eventid), 1, stdout);
            start_pos++;
        }
    }